

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

void __thiscall
burst::
subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
::increment(subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
            *this)

{
  iterator iVar1;
  __normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> _Var2;
  difference_type dVar3;
  __normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  new_subset_end;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  *this_local;
  
  iVar1 = subset_begin(this);
  _Var2 = subset_end(this);
  _Var2 = next_subset<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*,std::greater<void>>
                    (iVar1._M_current,_Var2._M_current,this->m_begin,this->m_end);
  iVar1 = subset_begin(this);
  dVar3 = std::
          distance<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>>
                    ((__normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
                      )iVar1._M_current,_Var2);
  this->m_subset_size = dVar3;
  return;
}

Assistant:

void increment ()
        {
            const auto new_subset_end =
                next_subset(subset_begin(), subset_end(), m_begin, m_end, m_compare);
            m_subset_size = std::distance(subset_begin(), new_subset_end);
        }